

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_of_detail.c
# Opt level: O1

bool_t prf_level_of_detail_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint8_t *buffer;
  bool_t bVar1;
  
  if (node->opcode == prf_level_of_detail_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    buffer = node->data;
    bf_write(bfile,buffer,8);
    bf_put_int32_be(bfile,*(int32_t *)(buffer + 8));
    bf_put_float64_be(bfile,*(float64_t *)(buffer + 0x10));
    bf_put_float64_be(bfile,*(float64_t *)(buffer + 0x18));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x20));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x22));
    bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x24));
    bf_put_float64_be(bfile,*(float64_t *)(buffer + 0x28));
    bf_put_float64_be(bfile,*(float64_t *)(buffer + 0x30));
    bf_put_float64_be(bfile,*(float64_t *)(buffer + 0x38));
    bf_put_float64_be(bfile,*(float64_t *)(buffer + 0x40));
    bVar1 = 1;
    if (0x48 < node->length) {
      bf_write(bfile,node->data + 0x48,node->length - 0x48);
    }
  }
  else {
    bVar1 = 0;
    prf_error(9,"tried level of detail save method on node of type %d.");
  }
  return bVar1;
}

Assistant:

static bool_t
prf_level_of_detail_save_f(prf_node_t * node,
                           prf_state_t * state,
                           bfile_t * bfile)
{
  int pos;

  assert(node != NULL && bfile != NULL);

  if (node->opcode != prf_level_of_detail_info.opcode) {
    prf_error(9, "tried level of detail save method on node of type %d.",
              node->opcode);
    return FALSE;
  }

  bf_put_uint16_be(bfile, node->opcode);
  bf_put_uint16_be(bfile, node->length);

  pos = 4;
  do {
    node_data * data;
    data = (node_data *) node->data;

    bf_write(bfile, data->id, 8); pos += 8;
    bf_put_int32_be(bfile, data->reserved); pos += 4;
    bf_put_float64_be(bfile, data->switch_in_distance); pos += 8;
    bf_put_float64_be(bfile, data->switch_out_distance); pos += 8;
    bf_put_int16_be(bfile, data->special_effect_id1); pos += 2;
    bf_put_int16_be(bfile, data->special_effect_id2); pos += 2;
    bf_put_int32_be(bfile, data->flags); pos += 4;
    bf_put_float64_be(bfile, data->center_x); pos += 8;
    bf_put_float64_be(bfile, data->center_y); pos += 8;
    bf_put_float64_be(bfile, data->center_z); pos += 8;
    bf_put_float64_be(bfile, data->transition_range); pos += 8;

  } while (FALSE);
  
  if (node->length > pos) {
    pos += bf_write(bfile, node->data + pos - 4 + NODE_DATA_PAD,
                    node->length - pos);
  }
  return TRUE;
}